

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O1

void lj_snap_replay(jit_State *J,GCtrace *T)

{
  IRIns *pIVar1;
  byte bVar2;
  byte bVar3;
  char cVar4;
  uint uVar5;
  undefined4 uVar6;
  SnapShot *pSVar7;
  IRIns *pIVar8;
  bool bVar9;
  ushort uVar10;
  ushort uVar11;
  IRRef1 IVar12;
  uint uVar13;
  uint uVar14;
  TRef TVar15;
  TRef TVar16;
  TRef TVar17;
  ulong uVar18;
  IROpT IVar19;
  uint uVar20;
  ulong uVar21;
  IRIns *pIVar22;
  IRIns *pIVar23;
  IRRef1 IVar24;
  IRIns *pIVar25;
  ulong uVar26;
  uint uVar27;
  IRIns *pIVar28;
  SnapEntry *map;
  bool bVar29;
  IRRef allocref;
  ulong local_78;
  
  pSVar7 = T->snap;
  uVar5 = J->exitno;
  map = T->snapmap + pSVar7[uVar5].mapofs;
  bVar2 = pSVar7[uVar5].nent;
  uVar18 = (ulong)bVar2;
  bVar29 = false;
  J->framedepth = 0;
  if (bVar2 == 0) {
    bVar29 = true;
    local_78 = 0;
  }
  else {
    uVar26 = 0;
    local_78 = 0;
    do {
      uVar20 = map[uVar26];
      uVar27 = uVar20 >> 0x18;
      uVar14 = uVar20 & 0xffff;
      pIVar25 = (IRIns *)((ulong)(uVar14 * 8) + (long)T->ir);
      if ((local_78 >> ((ulong)uVar20 & 0x3f) & 1) == 0) {
LAB_00145854:
        local_78 = local_78 | 1L << ((byte)uVar20 & 0x3f);
        if (uVar14 < 0x8000) {
          uVar13 = snap_replay_const(J,pIVar25);
        }
        else if (((pIVar25->field_0).prev & 0xff80) == 0x80) {
          bVar29 = true;
          uVar13 = uVar27;
        }
        else {
          uVar10 = 0x21;
          if ((pIVar25->field_1).o == 'F') {
            uVar10 = (pIVar25->field_0).op2 & 0x10 | 0x21;
          }
          (J->fold).ins.field_0.ot = (pIVar25->field_1).t.irt & 0x1f | 0x4600;
          *(ushort *)&(J->fold).ins = (ushort)(byte)(uVar20 >> 0x18);
          (J->fold).ins.field_0.op2 = uVar10;
          uVar13 = lj_ir_emit(J);
        }
      }
      else {
        uVar13 = 0;
        if (uVar26 != 0) {
          uVar21 = 0;
          do {
            if ((map[uVar21] & 0xffff) == uVar14) {
              uVar13 = J->slot[map[uVar21] >> 0x18] & 0xfffcffff;
              break;
            }
            uVar21 = uVar21 + 1;
            uVar13 = 0;
          } while (uVar26 != uVar21);
        }
        if (uVar13 == 0) goto LAB_00145854;
      }
      J->slot[uVar27] = uVar13 | uVar20 & 0x30000;
      J->framedepth = J->framedepth + (uint)(0xffffff < uVar20 && (uVar20 & 0x30000) != 0);
      if ((uVar20 >> 0x10 & 1) != 0) {
        J->baseslot = uVar27 + 1;
      }
      uVar26 = uVar26 + 1;
    } while (uVar26 != uVar18);
    bVar29 = !bVar29;
  }
  bVar9 = true;
  if (!bVar29) {
    pIVar25 = T->ir + pSVar7[uVar5].ref;
    uVar20 = (uint)bVar2;
    if (bVar2 == 0) {
      bVar9 = false;
    }
    else {
      uVar26 = 0;
      bVar9 = false;
      do {
        uVar14 = map[uVar26];
        pIVar1 = T->ir + (uVar14 & 0xffff);
        if ((pIVar1->field_1).r == 0xfd) {
          if (J->slot[uVar14 >> 0x18] == uVar14 >> 0x18) {
            bVar3 = lj_ir_mode[(pIVar1->field_1).o];
            if ((bVar3 & 3) == 0) {
              snap_pref(J,T,map,uVar20,local_78,(uint)(pIVar1->field_0).op1);
            }
            if ((bVar3 & 0xc) == 0) {
              snap_pref(J,T,map,uVar20,local_78,(uint)(pIVar1->field_0).op2);
            }
            bVar9 = true;
            pIVar28 = pIVar1;
            if ((pIVar1->field_1).o != 'R') {
LAB_00145a12:
              pIVar23 = pIVar28;
              pIVar28 = pIVar23 + 1;
              if (pIVar28 < pIVar25) {
                if (*(char *)((long)pIVar23 + 0xe) == -2) {
                  if ((ulong)*(byte *)((long)pIVar23 + 0xf) == 0xff) {
                    uVar14 = *(byte *)((long)pIVar23 + 0xd) - 0x48;
                    if ((4 < uVar14) || (uVar14 == 2)) goto LAB_00145a12;
                    pIVar8 = T->ir;
                    pIVar22 = pIVar8 + (pIVar28->field_0).op1;
                    if (((pIVar22->field_1).o & 0xfe) == 0x38) {
                      pIVar22 = pIVar8 + (pIVar22->field_0).op1;
                    }
                    bVar29 = pIVar8 + (pIVar22->field_0).op1 == pIVar1;
                  }
                  else {
                    bVar29 = pIVar28 == pIVar1 + *(byte *)((long)pIVar23 + 0xf);
                  }
                  if ((bVar29) &&
                     (TVar15 = snap_pref(J,T,map,(uint)bVar2,local_78,
                                         (uint)*(ushort *)((long)pIVar23 + 10)), TVar15 == 0)) {
                    snap_pref(J,T,map,uVar20,local_78,
                              (uint)T->ir[*(ushort *)((long)pIVar23 + 10)].field_0.op1);
                  }
                }
                goto LAB_00145a12;
              }
            }
          }
        }
        else if ((0x7fff < (uVar14 & 0xffff)) && (((pIVar1->field_0).prev & 0xff80) == 0x80)) {
          TVar15 = snap_pref(J,T,map,(uint)bVar2,local_78,(uint)(pIVar1->field_0).op1);
          J->slot[uVar14 >> 0x18] = TVar15;
        }
        uVar26 = uVar26 + 1;
      } while (uVar26 != uVar18);
    }
    if ((bVar9) && (bVar2 != 0)) {
      uVar26 = 0;
      do {
        uVar21 = (ulong)(map[uVar26] & 0xffff);
        if (*(char *)((long)T->ir + uVar21 * 8 + 6) == -3) {
          uVar14 = map[uVar26] >> 0x18;
          if (J->slot[uVar14] == uVar14) {
            pIVar1 = T->ir + uVar21;
            uVar10 = (pIVar1->field_0).op1;
            bVar2 = lj_ir_mode[(pIVar1->field_1).o];
            if ((bVar2 & 3) == 0) {
              TVar15 = snap_pref(J,T,map,uVar20,local_78,(uint)uVar10);
              uVar10 = (ushort)TVar15;
            }
            uVar11 = (pIVar1->field_0).op2;
            if ((bVar2 & 0xc) == 0) {
              TVar15 = snap_pref(J,T,map,uVar20,local_78,(uint)uVar11);
              uVar11 = (ushort)TVar15;
            }
            if ((pIVar1->field_1).o != 'R') {
              (J->fold).ins.field_0.ot = (pIVar1->field_0).ot;
              (J->fold).ins.field_0.op1 = uVar10;
              (J->fold).ins.field_0.op2 = uVar11;
              TVar15 = lj_opt_fold(J);
              J->slot[uVar14] = TVar15;
              pIVar28 = pIVar1 + 1;
              if (pIVar28 < pIVar25) {
                do {
                  if ((pIVar28->field_1).r == 0xfe) {
                    if ((ulong)(pIVar28->field_1).s == 0xff) {
                      uVar14 = (pIVar28->field_1).o - 0x48;
                      if ((4 < uVar14) || (uVar14 == 2)) goto LAB_00145d2e;
                      pIVar22 = T->ir;
                      pIVar23 = pIVar22 + (pIVar28->field_0).op1;
                      if (((pIVar23->field_1).o & 0xfe) == 0x38) {
                        pIVar23 = pIVar22 + (pIVar23->field_0).op1;
                      }
                      bVar29 = pIVar22 + (pIVar23->field_0).op1 == pIVar1;
                    }
                    else {
                      bVar29 = pIVar28 == pIVar1 + (pIVar28->field_1).s;
                    }
                    if (!bVar29) goto LAB_00145d2e;
                    pIVar23 = T->ir;
                    uVar21 = (ulong)(pIVar28->field_0).op1;
                    uVar10 = *(ushort *)((long)pIVar23 + uVar21 * 8 + 2);
                    cVar4 = *(char *)((long)pIVar23 + uVar21 * 8 + 5);
                    TVar17 = TVar15;
                    if (cVar4 == '>') {
LAB_00145e0a:
                      (J->fold).ins.field_0.ot = *(IROpT *)((long)pIVar23 + uVar21 * 8 + 4);
                      (J->fold).ins.field_0.op1 = (IRRef1)TVar17;
                      (J->fold).ins.field_0.op2 = uVar10;
                      TVar17 = lj_opt_fold(J);
                      IVar24 = (IRRef1)TVar17;
                    }
                    else {
                      pIVar22 = pIVar23 + uVar10;
                      if (cVar4 == '9') {
                        TVar16 = snap_replay_const(J,pIVar23 + (pIVar22->field_0).op1);
                        TVar16 = lj_ir_kslot(J,TVar16,(uint)(pIVar22->field_0).op2);
                        uVar10 = (ushort)TVar16;
                      }
                      else {
                        TVar16 = snap_replay_const(J,pIVar22);
                        uVar10 = (ushort)TVar16;
                      }
                      bVar2 = *(byte *)((long)pIVar23 + uVar21 * 8 + 5);
                      bVar29 = true;
                      if (bVar2 - 0x38 < 2) {
                        uVar6 = *(undefined4 *)
                                 ((long)T->ir + (ulong)pIVar23[uVar21].field_0.op1 * 8 + 2);
                        (J->fold).ins.field_0.op1 = (IRRef1)TVar15;
                        *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = uVar6;
                        TVar17 = lj_opt_fold(J);
                        bVar29 = true;
                      }
                      else if (((bVar2 == 0x3b) &&
                               (uVar14 = (uint)J->chain[0x3b], (TVar15 & 0xffff) < uVar14)) &&
                              (*(ushort *)((long)(J->cur).ir + (ulong)uVar14 * 8 + 2) == uVar10)) {
                        bVar29 = false;
                        TVar17 = uVar14;
                      }
                      IVar24 = (IRRef1)TVar17;
                      if (bVar29) goto LAB_00145e0a;
                    }
                    TVar17 = snap_pref(J,T,map,uVar20,local_78,(uint)(pIVar28->field_0).op2);
                    if (TVar17 == 0) {
                      TVar17 = snap_pref(J,T,map,uVar20,local_78,
                                         (uint)T->ir[(pIVar28->field_0).op2].field_0.op1);
                      (J->fold).ins.field_0.op1 = (IRRef1)TVar17;
                      *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x590e01d3;
                      TVar17 = lj_opt_fold(J);
                    }
                    IVar12 = (IRRef1)TVar17;
                    IVar19 = (pIVar28->field_0).ot;
LAB_00145e9b:
                    (J->fold).ins.field_0.ot = IVar19;
                    (J->fold).ins.field_0.op1 = IVar24;
                    (J->fold).ins.field_0.op2 = IVar12;
                    lj_opt_fold(J);
                  }
                  else {
LAB_00145d2e:
                    if (((pIVar28->field_1).o == 'X') && ((pIVar1->field_1).o == 'Q')) {
                      IVar19 = 0x5800;
                      IVar24 = 0;
                      IVar12 = 0;
                      goto LAB_00145e9b;
                    }
                  }
                  pIVar28 = pIVar28 + 1;
                } while (pIVar28 < pIVar25);
              }
              goto LAB_00145c49;
            }
            (J->fold).ins.field_0.ot = (pIVar1->field_0).ot & 0xff9f;
            (J->fold).ins.field_0.op1 = uVar10;
            (J->fold).ins.field_0.op2 = uVar11;
            TVar15 = lj_opt_fold(J);
          }
          else {
            TVar15 = J->slot[J->slot[uVar14]];
          }
          J->slot[uVar14] = TVar15;
        }
LAB_00145c49:
      } while ((bVar9) && (uVar26 = uVar26 + 1, uVar26 < uVar18));
    }
    bVar9 = !bVar9;
  }
  J->base = J->slot + J->baseslot;
  J->maxslot = (uint)pSVar7[uVar5].nslots - J->baseslot;
  lj_snap_add(J);
  if (!bVar9) {
    (J->fold).ins.field_0.ot = 0xf80;
    (J->fold).ins.field_1.op12 = 0;
    lj_ir_emit(J);
    return;
  }
  return;
}

Assistant:

void lj_snap_replay(jit_State *J, GCtrace *T)
{
  SnapShot *snap = &T->snap[J->exitno];
  SnapEntry *map = &T->snapmap[snap->mapofs];
  MSize n, nent = snap->nent;
  BloomFilter seen = 0;
  int pass23 = 0;
  J->framedepth = 0;
  /* Emit IR for slots inherited from parent snapshot. */
  for (n = 0; n < nent; n++) {
    SnapEntry sn = map[n];
    BCReg s = snap_slot(sn);
    IRRef ref = snap_ref(sn);
    IRIns *ir = &T->ir[ref];
    TRef tr;
    /* The bloom filter avoids O(nent^2) overhead for de-duping slots. */
    if (bloomtest(seen, ref) && (tr = snap_dedup(J, map, n, ref)) != 0)
      goto setslot;
    bloomset(seen, ref);
    if (irref_isk(ref)) {
      /* See special treatment of LJ_FR2 slot 1 in snapshot_slots() above. */
      if (LJ_FR2 && (sn == SNAP(1, SNAP_FRAME | SNAP_NORESTORE, REF_NIL)))
	tr = 0;
      else
	tr = snap_replay_const(J, ir);
    } else if (!regsp_used(ir->prev)) {
      pass23 = 1;
      lj_assertJ(s != 0, "unused slot 0 in snapshot");
      tr = s;
    } else {
      IRType t = irt_type(ir->t);
      uint32_t mode = IRSLOAD_INHERIT|IRSLOAD_PARENT;
      if (LJ_SOFTFP32 && (sn & SNAP_SOFTFPNUM)) t = IRT_NUM;
      if (ir->o == IR_SLOAD) mode |= (ir->op2 & IRSLOAD_READONLY);
      tr = emitir_raw(IRT(IR_SLOAD, t), s, mode);
    }
  setslot:
    J->slot[s] = tr | (sn&(SNAP_CONT|SNAP_FRAME));  /* Same as TREF_* flags. */
    J->framedepth += ((sn & (SNAP_CONT|SNAP_FRAME)) && (s != LJ_FR2));
    if ((sn & SNAP_FRAME))
      J->baseslot = s+1;
  }
  if (pass23) {
    IRIns *irlast = &T->ir[snap->ref];
    pass23 = 0;
    /* Emit dependent PVALs. */
    for (n = 0; n < nent; n++) {
      SnapEntry sn = map[n];
      IRRef refp = snap_ref(sn);
      IRIns *ir = &T->ir[refp];
      if (regsp_reg(ir->r) == RID_SUNK) {
	uint8_t m;
	if (J->slot[snap_slot(sn)] != snap_slot(sn)) continue;
	pass23 = 1;
	lj_assertJ(ir->o == IR_TNEW || ir->o == IR_TDUP ||
		   ir->o == IR_CNEW || ir->o == IR_CNEWI,
		   "sunk parent IR %04d has bad op %d", refp - REF_BIAS, ir->o);
	m = lj_ir_mode[ir->o];
	if (irm_op1(m) == IRMref) snap_pref(J, T, map, nent, seen, ir->op1);
	if (irm_op2(m) == IRMref) snap_pref(J, T, map, nent, seen, ir->op2);
	if (LJ_HASFFI && ir->o == IR_CNEWI) {
	  if (LJ_32 && refp+1 < T->nins && (ir+1)->o == IR_HIOP)
	    snap_pref(J, T, map, nent, seen, (ir+1)->op2);
	} else {
	  IRIns *irs;
	  for (irs = ir+1; irs < irlast; irs++)
	    if (irs->r == RID_SINK && snap_sunk_store(T, ir, irs)) {
	      if (snap_pref(J, T, map, nent, seen, irs->op2) == 0)
		snap_pref(J, T, map, nent, seen, T->ir[irs->op2].op1);
	      else if ((LJ_SOFTFP32 || (LJ_32 && LJ_HASFFI)) &&
		       irs+1 < irlast && (irs+1)->o == IR_HIOP)
		snap_pref(J, T, map, nent, seen, (irs+1)->op2);
	    }
	}
      } else if (!irref_isk(refp) && !regsp_used(ir->prev)) {
	lj_assertJ(ir->o == IR_CONV && ir->op2 == IRCONV_NUM_INT,
		   "sunk parent IR %04d has bad op %d", refp - REF_BIAS, ir->o);
	J->slot[snap_slot(sn)] = snap_pref(J, T, map, nent, seen, ir->op1);
      }
    }
    /* Replay sunk instructions. */
    for (n = 0; pass23 && n < nent; n++) {
      SnapEntry sn = map[n];
      IRRef refp = snap_ref(sn);
      IRIns *ir = &T->ir[refp];
      if (regsp_reg(ir->r) == RID_SUNK) {
	TRef op1, op2;
	uint8_t m;
	if (J->slot[snap_slot(sn)] != snap_slot(sn)) {  /* De-dup allocs. */
	  J->slot[snap_slot(sn)] = J->slot[J->slot[snap_slot(sn)]];
	  continue;
	}
	op1 = ir->op1;
	m = lj_ir_mode[ir->o];
	if (irm_op1(m) == IRMref) op1 = snap_pref(J, T, map, nent, seen, op1);
	op2 = ir->op2;
	if (irm_op2(m) == IRMref) op2 = snap_pref(J, T, map, nent, seen, op2);
	if (LJ_HASFFI && ir->o == IR_CNEWI) {
	  if (LJ_32 && refp+1 < T->nins && (ir+1)->o == IR_HIOP) {
	    lj_needsplit(J);  /* Emit joining HIOP. */
	    op2 = emitir_raw(IRT(IR_HIOP, IRT_I64), op2,
			     snap_pref(J, T, map, nent, seen, (ir+1)->op2));
	  }
	  J->slot[snap_slot(sn)] = emitir(ir->ot & ~(IRT_MARK|IRT_ISPHI), op1, op2);
	} else {
	  IRIns *irs;
	  TRef tr = emitir(ir->ot, op1, op2);
	  J->slot[snap_slot(sn)] = tr;
	  for (irs = ir+1; irs < irlast; irs++)
	    if (irs->r == RID_SINK && snap_sunk_store(T, ir, irs)) {
	      IRIns *irr = &T->ir[irs->op1];
	      TRef val, key = irr->op2, tmp = tr;
	      if (irr->o != IR_FREF) {
		IRIns *irk = &T->ir[key];
		if (irr->o == IR_HREFK)
		  key = lj_ir_kslot(J, snap_replay_const(J, &T->ir[irk->op1]),
				    irk->op2);
		else
		  key = snap_replay_const(J, irk);
		if (irr->o == IR_HREFK || irr->o == IR_AREF) {
		  IRIns *irf = &T->ir[irr->op1];
		  tmp = emitir(irf->ot, tmp, irf->op2);
		} else if (irr->o == IR_NEWREF) {
		  IRRef allocref = tref_ref(tr);
		  IRRef keyref = tref_ref(key);
		  IRRef newref_ref = J->chain[IR_NEWREF];
		  IRIns *newref = &J->cur.ir[newref_ref];
		  lj_assertJ(irref_isk(keyref),
			     "sunk store for parent IR %04d with bad key %04d",
			     refp - REF_BIAS, keyref - REF_BIAS);
		  if (newref_ref > allocref && newref->op2 == keyref) {
		    lj_assertJ(newref->op1 == allocref,
			       "sunk store for parent IR %04d with bad tab %04d",
			       refp - REF_BIAS, allocref - REF_BIAS);
		    tmp = newref_ref;
		    goto skip_newref;
		  }
		}
	      }
	      tmp = emitir(irr->ot, tmp, key);
	    skip_newref:
	      val = snap_pref(J, T, map, nent, seen, irs->op2);
	      if (val == 0) {
		IRIns *irc = &T->ir[irs->op2];
		lj_assertJ(irc->o == IR_CONV && irc->op2 == IRCONV_NUM_INT,
			   "sunk store for parent IR %04d with bad op %d",
			   refp - REF_BIAS, irc->o);
		val = snap_pref(J, T, map, nent, seen, irc->op1);
		val = emitir(IRTN(IR_CONV), val, IRCONV_NUM_INT);
	      } else if ((LJ_SOFTFP32 || (LJ_32 && LJ_HASFFI)) &&
			 irs+1 < irlast && (irs+1)->o == IR_HIOP) {
		IRType t = IRT_I64;
		if (LJ_SOFTFP32 && irt_type((irs+1)->t) == IRT_SOFTFP)
		  t = IRT_NUM;
		lj_needsplit(J);
		if (irref_isk(irs->op2) && irref_isk((irs+1)->op2)) {
		  uint64_t k = (uint32_t)T->ir[irs->op2].i +
			       ((uint64_t)T->ir[(irs+1)->op2].i << 32);
		  val = lj_ir_k64(J, t == IRT_I64 ? IR_KINT64 : IR_KNUM, k);
		} else {
		  val = emitir_raw(IRT(IR_HIOP, t), val,
			  snap_pref(J, T, map, nent, seen, (irs+1)->op2));
		}
		tmp = emitir(IRT(irs->o, t), tmp, val);
		continue;
	      }
	      tmp = emitir(irs->ot, tmp, val);
	    } else if (LJ_HASFFI && irs->o == IR_XBAR && ir->o == IR_CNEW) {
	      emitir(IRT(IR_XBAR, IRT_NIL), 0, 0);
	    }
	}
      }
    }
  }
  J->base = J->slot + J->baseslot;
  J->maxslot = snap->nslots - J->baseslot;
  lj_snap_add(J);
  if (pass23)  /* Need explicit GC step _after_ initial snapshot. */
    emitir_raw(IRTG(IR_GCSTEP, IRT_NIL), 0, 0);
}